

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase267::run(TestCase267 *this)

{
  Reader copyFrom;
  char *local_168;
  ArrayPtr<const_char> local_160;
  Orphan<capnp::Text> orphan;
  Builder root;
  bool local_108;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  root._builder._0_16_ = MessageBuilder::getOrphanage(&builder.super_MessageBuilder);
  copyFrom.super_StringPtr.content.size_ = 9;
  copyFrom.super_StringPtr.content.ptr = "foobarba";
  Orphanage::newOrphanCopy<capnp::Text::Reader>(&orphan,(Orphanage *)&root,copyFrom);
  local_168 = "foobarba";
  local_160 = (ArrayPtr<const_char>)OrphanBuilder::asTextReader(&orphan.builder);
  kj::_::DebugExpression<char_const(&)[9]>::operator==
            ((DebugComparison<const_char_(&)[9],_capnp::Text::Reader> *)&root,
             (DebugExpression<char_const(&)[9]> *)&local_168,(Reader *)&local_160);
  if ((local_108 == false) && (kj::_::Debug::minSeverity < 3)) {
    local_160 = (ArrayPtr<const_char>)OrphanBuilder::asTextReader(&orphan.builder);
    kj::_::Debug::
    log<char_const(&)[54],kj::_::DebugComparison<char_const(&)[9],capnp::Text::Reader>&,char_const(&)[9],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x10f,ERROR,
               "\"failed: expected \" \"(\\\"foobarba\\\") == (orphan.getReader())\", _kjCondition, \"foobarba\", orphan.getReader()"
               ,(char (*) [54])"failed: expected (\"foobarba\") == (orphan.getReader())",
               (DebugComparison<const_char_(&)[9],_capnp::Text::Reader> *)&root,
               (char (*) [9])"foobarba",(Reader *)&local_160);
  }
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root,&builder.super_MessageBuilder);
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptTextField(&root,&orphan);
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Orphans, OrphanageTextCopy) {
  MallocMessageBuilder builder;

  Orphan<Text> orphan = builder.getOrphanage().newOrphanCopy(Text::Reader("foobarba"));
  EXPECT_EQ("foobarba", orphan.getReader());

  auto root = builder.initRoot<TestAllTypes>();
  root.adoptTextField(kj::mv(orphan));
}